

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int dotlockClose(sqlite3_file *id)

{
  unixFile *pFile;
  
  if (id != (sqlite3_file *)0x0) {
    dotlockUnlock(id,0);
    sqlite3_free(id[5].pMethods);
    closeUnixFile(id);
  }
  return 0;
}

Assistant:

static int dotlockClose(sqlite3_file *id) {
  int rc = SQLITE_OK;
  if( id ){
    unixFile *pFile = (unixFile*)id;
    dotlockUnlock(id, NO_LOCK);
    sqlite3_free(pFile->lockingContext);
    rc = closeUnixFile(id);
  }
  return rc;
}